

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid_soa.cpp
# Opt level: O1

pair<embree::NodeRefPtr<4>,_embree::LBBox<embree::Vec3fa>_> * __thiscall
embree::sse2::GridSOA::buildMSMBlurBVH
          (pair<embree::NodeRefPtr<4>,_embree::LBBox<embree::Vec3fa>_> *__return_storage_ptr__,
          GridSOA *this,range<int> *time_range,size_t *allocator,BBox3fa *bounds_o)

{
  BBox3fa *pBVar1;
  undefined8 uVar2;
  long lVar3;
  int iVar4;
  Vec3fa *pVVar5;
  int iVar6;
  pair<embree::NodeRefPtr<4>,_embree::LBBox<embree::Vec3fa>_> *root_bounds;
  size_t sVar7;
  char *pcVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar16;
  float fVar17;
  undefined1 auVar15 [16];
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar25;
  float fVar26;
  undefined1 auVar24 [16];
  float fVar27;
  undefined1 auVar28 [16];
  float fVar29;
  float fVar30;
  undefined1 auVar31 [16];
  float fVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float fVar35;
  GridRange range;
  range<int> local_b0;
  pair<embree::NodeRefPtr<4>,_embree::LBBox<embree::Vec3fa>_> *local_a8;
  GridSOA *local_a0;
  char *local_98;
  ulong local_90;
  pair<embree::NodeRefPtr<4>,_embree::LBBox<embree::Vec3fa>_> local_88;
  
  sVar7 = (size_t)time_range->_begin;
  if (time_range->_end - time_range->_begin == 1) {
    local_88.first.ptr._4_4_ = this->width - 1;
    local_88._12_4_ = this->height - 1;
    local_88.first.ptr._0_4_ = 0;
    local_88._8_4_ = 0;
    buildMBlurBVH(__return_storage_ptr__,this,sVar7,(GridRange *)&local_88,allocator);
    *(size_t *)(this->data + (ulong)this->rootOffset + sVar7 * 8) =
         (__return_storage_ptr__->first).ptr;
    uVar2 = *(undefined8 *)((long)&(__return_storage_ptr__->second).bounds0.lower.field_0 + 8);
    *(undefined8 *)&bounds_o[sVar7].lower.field_0 =
         *(undefined8 *)&(__return_storage_ptr__->second).bounds0.lower.field_0;
    *(undefined8 *)((long)&bounds_o[sVar7].lower.field_0 + 8) = uVar2;
    uVar2 = *(undefined8 *)((long)&(__return_storage_ptr__->second).bounds0.upper.field_0 + 8);
    *(undefined8 *)&bounds_o[sVar7].upper.field_0 =
         *(undefined8 *)&(__return_storage_ptr__->second).bounds0.upper.field_0;
    *(undefined8 *)((long)&bounds_o[sVar7].upper.field_0 + 8) = uVar2;
    uVar2 = *(undefined8 *)((long)&(__return_storage_ptr__->second).bounds1.lower.field_0 + 8);
    *(undefined8 *)&bounds_o[sVar7 + 1].lower.field_0 =
         *(undefined8 *)&(__return_storage_ptr__->second).bounds1.lower.field_0;
    *(undefined8 *)((long)&bounds_o[sVar7 + 1].lower.field_0 + 8) = uVar2;
    uVar2 = *(undefined8 *)((long)&(__return_storage_ptr__->second).bounds1.upper.field_0 + 8);
    *(undefined8 *)&bounds_o[sVar7 + 1].upper.field_0 =
         *(undefined8 *)&(__return_storage_ptr__->second).bounds1.upper.field_0;
    *(undefined8 *)((long)&bounds_o[sVar7 + 1].upper.field_0 + 8) = uVar2;
  }
  else {
    sVar7 = *allocator;
    pcVar8 = this->data + sVar7;
    *allocator = sVar7 + 0x100;
    *(undefined8 *)(this[4].data + sVar7) = 0x7f8000007f800000;
    *(undefined8 *)(this[5].data + (sVar7 - 0x30)) = 0x7f8000007f800000;
    *(undefined4 *)(this[5].data + (sVar7 - 0x28)) = 0xff800000;
    *(undefined4 *)(this[5].data + (sVar7 - 0x24)) = 0xff800000;
    *(undefined4 *)(this[5].data + (sVar7 - 0x20)) = 0xff800000;
    *(undefined4 *)(this[5].data + (sVar7 - 0x1c)) = 0xff800000;
    *(undefined8 *)(this[2].data + (sVar7 - 0x10)) = 0x7f8000007f800000;
    *(undefined8 *)(this[2].data + (sVar7 - 8)) = 0x7f8000007f800000;
    *(undefined8 *)(this[2].data + (sVar7 - 0x30)) = 0x7f8000007f800000;
    *(undefined8 *)(this[2].data + (sVar7 - 0x28)) = 0x7f8000007f800000;
    *(undefined8 *)(this[1].data + (sVar7 - 0x18)) = 0x7f8000007f800000;
    *(undefined8 *)(this[1].data + (sVar7 - 0x10)) = 0x7f8000007f800000;
    *(undefined4 *)(this[2].data + sVar7) = 0xff800000;
    *(undefined4 *)(this[2].data + sVar7 + 4) = 0xff800000;
    *(undefined4 *)(this[3].data + (sVar7 - 0x30)) = 0xff800000;
    *(undefined4 *)(this[3].data + (sVar7 - 0x2c)) = 0xff800000;
    *(undefined4 *)(this[2].data + (sVar7 - 0x20)) = 0xff800000;
    *(undefined4 *)(this[2].data + (sVar7 - 0x1c)) = 0xff800000;
    *(undefined4 *)(this[2].data + (sVar7 - 0x18)) = 0xff800000;
    *(undefined4 *)(this[2].data + (sVar7 - 0x14)) = 0xff800000;
    *(undefined4 *)(this[1].data + (sVar7 - 8)) = 0xff800000;
    *(undefined4 *)(this[1].data + (sVar7 - 4)) = 0xff800000;
    *(undefined4 *)(this[1].data + sVar7) = 0xff800000;
    *(undefined4 *)(this[1].data + sVar7 + 4) = 0xff800000;
    *(undefined8 *)(this[3].data + (sVar7 - 0x28)) = 0;
    *(undefined8 *)(this[3].data + (sVar7 - 0x20)) = 0;
    *(undefined8 *)(this[3].data + (sVar7 - 0x18)) = 0;
    *(undefined8 *)(this[3].data + (sVar7 - 0x10)) = 0;
    *(undefined8 *)(this[3].data + (sVar7 - 8)) = 0;
    *(undefined8 *)(this[3].data + sVar7) = 0;
    *(undefined8 *)(this[4].data + (sVar7 - 0x30)) = 0;
    *(undefined8 *)(this[4].data + (sVar7 - 0x28)) = 0;
    *(undefined8 *)(this[4].data + (sVar7 - 0x20)) = 0;
    *(undefined8 *)(this[4].data + (sVar7 - 0x18)) = 0;
    *(undefined8 *)(this[4].data + (sVar7 - 0x10)) = 0;
    *(undefined8 *)(this[4].data + (sVar7 - 8)) = 0;
    lVar3 = 0;
    do {
      *(undefined8 *)(pcVar8 + lVar3 * 8) = 8;
      *(undefined8 *)(pcVar8 + lVar3 * 8 + 8) = 8;
      lVar3 = lVar3 + 2;
    } while (lVar3 != 4);
    local_90 = 0;
    iVar9 = 0;
    local_a8 = __return_storage_ptr__;
    local_a0 = this;
    local_98 = pcVar8;
    do {
      iVar11 = time_range->_begin;
      iVar4 = time_range->_end - iVar11;
      iVar6 = iVar4 * iVar9;
      iVar10 = iVar6 + 3;
      if (-1 < iVar6) {
        iVar10 = iVar6;
      }
      iVar9 = iVar9 + 1;
      iVar4 = iVar4 * iVar9;
      iVar6 = iVar4 + 3;
      if (-1 < iVar4) {
        iVar6 = iVar4;
      }
      if (iVar10 >> 2 < iVar6 >> 2) {
        iVar10 = (iVar10 >> 2) + iVar11;
        iVar11 = (iVar6 >> 2) + iVar11;
        local_b0._begin = iVar10;
        local_b0._end = iVar11;
        buildMSMBlurBVH(&local_88,this,&local_b0,allocator,bounds_o);
        fVar13 = (float)(local_a0->time_steps - 1);
        fVar12 = (float)iVar10 / fVar13;
        fVar13 = (float)iVar11 / fVar13;
        fVar32 = 1.0 / (fVar13 - fVar12);
        fVar35 = -fVar12 * fVar32;
        fVar29 = 1.0 - fVar35;
        auVar24._0_4_ =
             local_88.second.bounds0.lower.field_0.m128[0] * fVar29 +
             local_88.second.bounds1.lower.field_0.m128[0] * fVar35;
        auVar24._4_4_ =
             local_88.second.bounds0.lower.field_0.m128[1] * fVar29 +
             local_88.second.bounds1.lower.field_0.m128[1] * fVar35;
        auVar24._8_4_ =
             local_88.second.bounds0.lower.field_0.m128[2] * fVar29 +
             local_88.second.bounds1.lower.field_0.m128[2] * fVar35;
        auVar24._12_4_ =
             local_88.second.bounds0.lower.field_0.m128[3] * fVar29 +
             local_88.second.bounds1.lower.field_0.m128[3] * fVar35;
        auVar31._0_4_ =
             fVar29 * local_88.second.bounds0.upper.field_0.m128[0] +
             fVar35 * local_88.second.bounds1.upper.field_0.m128[0];
        auVar31._4_4_ =
             fVar29 * local_88.second.bounds0.upper.field_0.m128[1] +
             fVar35 * local_88.second.bounds1.upper.field_0.m128[1];
        auVar31._8_4_ =
             fVar29 * local_88.second.bounds0.upper.field_0.m128[2] +
             fVar35 * local_88.second.bounds1.upper.field_0.m128[2];
        auVar31._12_4_ =
             fVar29 * local_88.second.bounds0.upper.field_0.m128[3] +
             fVar35 * local_88.second.bounds1.upper.field_0.m128[3];
        fVar32 = (1.0 - fVar12) * fVar32;
        fVar29 = 1.0 - fVar32;
        auVar15._0_4_ =
             local_88.second.bounds0.lower.field_0.m128[0] * fVar29 +
             local_88.second.bounds1.lower.field_0.m128[0] * fVar32;
        auVar15._4_4_ =
             local_88.second.bounds0.lower.field_0.m128[1] * fVar29 +
             local_88.second.bounds1.lower.field_0.m128[1] * fVar32;
        auVar15._8_4_ =
             local_88.second.bounds0.lower.field_0.m128[2] * fVar29 +
             local_88.second.bounds1.lower.field_0.m128[2] * fVar32;
        auVar15._12_4_ =
             local_88.second.bounds0.lower.field_0.m128[3] * fVar29 +
             local_88.second.bounds1.lower.field_0.m128[3] * fVar32;
        lVar3 = (long)(int)local_90;
        *(ulong *)(local_98 + lVar3 * 8) =
             CONCAT44(local_88.first.ptr._4_4_,(undefined4)local_88.first.ptr);
        auVar33._0_4_ =
             fVar29 * local_88.second.bounds0.upper.field_0.m128[0] +
             fVar32 * local_88.second.bounds1.upper.field_0.m128[0];
        auVar33._4_4_ =
             fVar29 * local_88.second.bounds0.upper.field_0.m128[1] +
             fVar32 * local_88.second.bounds1.upper.field_0.m128[1];
        auVar33._8_4_ =
             fVar29 * local_88.second.bounds0.upper.field_0.m128[2] +
             fVar32 * local_88.second.bounds1.upper.field_0.m128[2];
        auVar33._12_4_ =
             fVar29 * local_88.second.bounds0.upper.field_0.m128[3] +
             fVar32 * local_88.second.bounds1.upper.field_0.m128[3];
        auVar24 = minps(auVar24,_DAT_01ff1820);
        auVar31 = maxps(auVar31,_DAT_01ff1810);
        auVar15 = minps(auVar15,_DAT_01ff1820);
        auVar33 = maxps(auVar33,_DAT_01ff1810);
        fVar23 = auVar24._0_4_ - ABS(auVar24._0_4_) * 4.7683716e-07;
        fVar25 = auVar24._4_4_ - ABS(auVar24._4_4_) * 4.7683716e-07;
        fVar26 = auVar24._8_4_ - ABS(auVar24._8_4_) * 4.7683716e-07;
        fVar29 = ABS(auVar31._0_4_) * 4.7683716e-07 + auVar31._0_4_;
        fVar32 = ABS(auVar31._4_4_) * 4.7683716e-07 + auVar31._4_4_;
        fVar35 = ABS(auVar31._8_4_) * 4.7683716e-07 + auVar31._8_4_;
        *(float *)(local_98 + lVar3 * 4 + 0x20) = fVar23;
        *(float *)(local_98 + lVar3 * 4 + 0x40) = fVar25;
        *(float *)(local_98 + lVar3 * 4 + 0x60) = fVar26;
        *(float *)(local_98 + lVar3 * 4 + 0x30) = fVar29;
        *(float *)(local_98 + lVar3 * 4 + 0x50) = fVar32;
        *(float *)(local_98 + lVar3 * 4 + 0x70) = fVar35;
        *(float *)(local_98 + lVar3 * 4 + 0x80) =
             (auVar15._0_4_ - ABS(auVar15._0_4_) * 4.7683716e-07) - fVar23;
        *(float *)(local_98 + lVar3 * 4 + 0xa0) =
             (auVar15._4_4_ - ABS(auVar15._4_4_) * 4.7683716e-07) - fVar25;
        *(float *)(local_98 + lVar3 * 4 + 0xc0) =
             (auVar15._8_4_ - ABS(auVar15._8_4_) * 4.7683716e-07) - fVar26;
        *(float *)(local_98 + lVar3 * 4 + 0x90) =
             (ABS(auVar33._0_4_) * 4.7683716e-07 + auVar33._0_4_) - fVar29;
        *(float *)(local_98 + lVar3 * 4 + 0xb0) =
             (ABS(auVar33._4_4_) * 4.7683716e-07 + auVar33._4_4_) - fVar32;
        *(float *)(local_98 + lVar3 * 4 + 0xd0) =
             (ABS(auVar33._8_4_) * 4.7683716e-07 + auVar33._8_4_) - fVar35;
        *(float *)(local_98 + lVar3 * 4 + 0xe0) = fVar12;
        *(uint *)(local_98 + lVar3 * 4 + 0xf0) =
             -(uint)(fVar13 == 1.0) & 0x3f800001 | ~-(uint)(fVar13 == 1.0) & (uint)fVar13;
        local_90 = (ulong)((int)local_90 + 1);
        pcVar8 = local_98;
        this = local_a0;
      }
    } while (iVar9 != 4);
    lVar3 = (long)time_range->_begin;
    iVar9 = time_range->_end;
    pBVar1 = bounds_o + lVar3;
    fVar14 = (pBVar1->lower).field_0.m128[0];
    fVar16 = (pBVar1->lower).field_0.m128[1];
    fVar17 = (pBVar1->lower).field_0.m128[2];
    fVar18 = (pBVar1->lower).field_0.m128[3];
    pVVar5 = &bounds_o[lVar3].upper;
    fVar12 = (pVVar5->field_0).m128[0];
    fVar13 = (pVVar5->field_0).m128[1];
    fVar29 = (pVVar5->field_0).m128[2];
    fVar32 = (pVVar5->field_0).m128[3];
    pBVar1 = bounds_o + iVar9;
    fVar35 = (pBVar1->lower).field_0.m128[0];
    fVar23 = (pBVar1->lower).field_0.m128[1];
    fVar25 = (pBVar1->lower).field_0.m128[2];
    fVar26 = (pBVar1->lower).field_0.m128[3];
    pVVar5 = &bounds_o[iVar9].upper;
    fVar19 = (pVVar5->field_0).m128[0];
    fVar20 = (pVVar5->field_0).m128[1];
    fVar21 = (pVVar5->field_0).m128[2];
    fVar22 = (pVVar5->field_0).m128[3];
    iVar11 = iVar9 - time_range->_begin;
    if ((iVar11 != 1) && ((int)(lVar3 + 1) < iVar9)) {
      pVVar5 = &bounds_o[lVar3 + 1].upper;
      iVar9 = 1;
      do {
        fVar27 = (float)iVar9 / (float)iVar11;
        fVar30 = 1.0 - fVar27;
        auVar28._0_4_ =
             (((BBox3fa *)(pVVar5 + -1))->lower).field_0.m128[0] -
             (fVar14 * fVar30 + fVar35 * fVar27);
        auVar28._4_4_ =
             (((BBox3fa *)(pVVar5 + -1))->lower).field_0.m128[1] -
             (fVar16 * fVar30 + fVar23 * fVar27);
        auVar28._8_4_ =
             (((BBox3fa *)(pVVar5 + -1))->lower).field_0.m128[2] -
             (fVar17 * fVar30 + fVar25 * fVar27);
        auVar28._12_4_ =
             (((BBox3fa *)(pVVar5 + -1))->lower).field_0.m128[3] -
             (fVar18 * fVar30 + fVar26 * fVar27);
        auVar34._0_4_ = (pVVar5->field_0).m128[0] - (fVar30 * fVar12 + fVar27 * fVar19);
        auVar34._4_4_ = (pVVar5->field_0).m128[1] - (fVar30 * fVar13 + fVar27 * fVar20);
        auVar34._8_4_ = (pVVar5->field_0).m128[2] - (fVar30 * fVar29 + fVar27 * fVar21);
        auVar34._12_4_ = (pVVar5->field_0).m128[3] - (fVar30 * fVar32 + fVar27 * fVar22);
        auVar15 = minps(auVar28,ZEXT816(0));
        auVar24 = maxps(auVar34,ZEXT816(0));
        fVar14 = fVar14 + auVar15._0_4_;
        fVar16 = fVar16 + auVar15._4_4_;
        fVar17 = fVar17 + auVar15._8_4_;
        fVar18 = fVar18 + auVar15._12_4_;
        fVar35 = fVar35 + auVar15._0_4_;
        fVar23 = fVar23 + auVar15._4_4_;
        fVar25 = fVar25 + auVar15._8_4_;
        fVar26 = fVar26 + auVar15._12_4_;
        fVar12 = fVar12 + auVar24._0_4_;
        fVar13 = fVar13 + auVar24._4_4_;
        fVar29 = fVar29 + auVar24._8_4_;
        fVar32 = fVar32 + auVar24._12_4_;
        fVar19 = fVar19 + auVar24._0_4_;
        fVar20 = fVar20 + auVar24._4_4_;
        fVar21 = fVar21 + auVar24._8_4_;
        fVar22 = fVar22 + auVar24._12_4_;
        iVar9 = iVar9 + 1;
        pVVar5 = pVVar5 + 2;
      } while (iVar11 != iVar9);
    }
    (local_a8->first).ptr = (ulong)pcVar8 | 6;
    (local_a8->second).bounds0.lower.field_0.m128[0] = fVar14;
    (local_a8->second).bounds0.lower.field_0.m128[1] = fVar16;
    (local_a8->second).bounds0.lower.field_0.m128[2] = fVar17;
    (local_a8->second).bounds0.lower.field_0.m128[3] = fVar18;
    (local_a8->second).bounds0.upper.field_0.m128[0] = fVar12;
    (local_a8->second).bounds0.upper.field_0.m128[1] = fVar13;
    (local_a8->second).bounds0.upper.field_0.m128[2] = fVar29;
    (local_a8->second).bounds0.upper.field_0.m128[3] = fVar32;
    (local_a8->second).bounds1.lower.field_0.m128[0] = fVar35;
    (local_a8->second).bounds1.lower.field_0.m128[1] = fVar23;
    (local_a8->second).bounds1.lower.field_0.m128[2] = fVar25;
    (local_a8->second).bounds1.lower.field_0.m128[3] = fVar26;
    (local_a8->second).bounds1.upper.field_0.m128[0] = fVar19;
    (local_a8->second).bounds1.upper.field_0.m128[1] = fVar20;
    (local_a8->second).bounds1.upper.field_0.m128[2] = fVar21;
    (local_a8->second).bounds1.upper.field_0.m128[3] = fVar22;
    __return_storage_ptr__ = local_a8;
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<BVH4::NodeRef,LBBox3fa> GridSOA::buildMSMBlurBVH(const range<int> time_range, size_t& allocator, BBox3fa* bounds_o)
    {
      assert(time_range.size() > 0);
      if (time_range.size() == 1) 
      {
        size_t t = time_range.begin();
        GridRange range(0,width-1,0,height-1);
        std::pair<BVH4::NodeRef,LBBox3fa> root_bounds = buildMBlurBVH(t,range,allocator);
        root(t) = root_bounds.first;
        bounds_o[t+0] = root_bounds.second.bounds0;
        bounds_o[t+1] = root_bounds.second.bounds1;
        return root_bounds;
      }

      /* allocate new bvh4 node */
      BVH4::AABBNodeMB4D* node = (BVH4::AABBNodeMB4D*)&bvhData()[allocator];
      allocator += sizeof(BVH4::AABBNodeMB4D);
      node->clear();

      for (int i=0, j=0; i<4; i++) 
      {
        const int begin = time_range.begin() + (i+0)*time_range.size()/4;
        const int end   = time_range.begin() + (i+1)*time_range.size()/4;
        if (end-begin <= 0) continue;
        std::pair<BVH4::NodeRef,LBBox3fa> node_bounds = buildMSMBlurBVH(make_range(begin,end),allocator,bounds_o);
        const float t0 = float(begin)/float(time_steps-1);
        const float t1 = float(end  )/float(time_steps-1);
        BVH4::NodeRecordMB4D nodeRecord;
        nodeRecord.ref = node_bounds.first;
        nodeRecord.lbounds = node_bounds.second;
        nodeRecord.dt = BBox1f(t0, t1);
        node->set(j,nodeRecord);
        j++;
      }

      const LBBox3fa lbounds = LBBox3fa([&] ( int i ) { return bounds_o[i]; }, time_range, time_steps-1);
      return std::make_pair(BVH4::encodeNode(node),lbounds);
    }